

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FG_SolverMaxPlus.cpp
# Opt level: O0

double __thiscall FG_SolverMaxPlus::Solve(FG_SolverMaxPlus *this)

{
  int *piVar1;
  long lVar2;
  undefined8 uVar3;
  ostream *poVar4;
  void *pvVar5;
  char *pcVar6;
  code *ctx;
  long in_RDI;
  double dVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *sol_vec;
  valConf *vc;
  double value;
  size_t nrConfsFound;
  double timeSpentInS;
  clock_t utime;
  double value_1;
  Index restI;
  MaxPlus mp;
  double tol;
  size_t verb;
  MaxPlus *in_stack_000003f0;
  Properties props;
  tms ts_after;
  tms ts_before;
  MaxPlus *in_stack_fffffffffffffb60;
  PropertyKey *in_stack_fffffffffffffb68;
  EDeadline *in_stack_fffffffffffffb70;
  list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_fffffffffffffb78;
  list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_fffffffffffffb80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb88;
  allocator<char> *in_stack_fffffffffffffb90;
  char *in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  string local_3f8 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_3d8;
  reference local_3d0;
  double local_3c8;
  ulong local_3c0;
  double local_3b8;
  long local_3b0;
  double local_3a8;
  uint local_39c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd48;
  double in_stack_fffffffffffffda8;
  Properties *in_stack_fffffffffffffdb0;
  FactorGraph *in_stack_fffffffffffffdb8;
  MaxPlus *in_stack_fffffffffffffdc0;
  allocator<char> local_189;
  string local_188 [32];
  undefined8 local_168;
  allocator<char> local_151;
  string local_150 [47];
  allocator<char> local_121;
  string local_120 [47];
  allocator<char> local_f1;
  string local_f0 [32];
  int local_d0;
  int local_cc;
  long local_c8;
  allocator<char> local_a1;
  string local_a0 [80];
  tms local_50;
  tms local_30;
  double local_8;
  
  times(&local_30);
  libDAI::Properties::Properties((Properties *)0x89d609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  boost::any::any<unsigned_long&>
            ((any *)in_stack_fffffffffffffb90,(unsigned_long *)in_stack_fffffffffffffb88,
             in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  libDAI::Properties::Set
            ((Properties *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (PropertyValue *)in_stack_fffffffffffffb60);
  boost::any::~any((any *)in_stack_fffffffffffffb60);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  local_cc = *(int *)(in_RDI + 0x50) + -3;
  local_d0 = 0;
  piVar1 = std::max<int>(&local_cc,&local_d0);
  local_c8 = (long)*piVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  boost::any::any<unsigned_long&>
            ((any *)in_stack_fffffffffffffb90,(unsigned_long *)in_stack_fffffffffffffb88,
             in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  libDAI::Properties::Set
            ((Properties *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (PropertyValue *)in_stack_fffffffffffffb60);
  boost::any::~any((any *)in_stack_fffffffffffffb60);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  boost::any::any<std::__cxx11::string&>
            ((any *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
             in_stack_fffffffffffffb78);
  libDAI::Properties::Set
            ((Properties *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (PropertyValue *)in_stack_fffffffffffffb60);
  boost::any::~any((any *)in_stack_fffffffffffffb60);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  boost::any::any<double&>
            ((any *)in_stack_fffffffffffffb90,(double *)in_stack_fffffffffffffb88,
             in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  libDAI::Properties::Set
            ((Properties *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (PropertyValue *)in_stack_fffffffffffffb60);
  boost::any::~any((any *)in_stack_fffffffffffffb60);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  local_168 = 0x3f847ae147ae147b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  boost::any::any<double&>
            ((any *)in_stack_fffffffffffffb90,(double *)in_stack_fffffffffffffb88,
             in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  libDAI::Properties::Set
            ((Properties *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (PropertyValue *)in_stack_fffffffffffffb60);
  boost::any::~any((any *)in_stack_fffffffffffffb60);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  ctx = *(code **)(in_RDI + 8);
  libDAI::MaxPlus::MaxPlus
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
             (size_t)in_stack_fffffffffffffda8);
  local_39c = 0;
  do {
    if (*(ulong *)(in_RDI + 0x68) <= (ulong)local_39c) {
      libDAI::MaxPlus::GetBestConfigurations_abi_cxx11_((MaxPlus *)&stack0xfffffffffffffc68);
      std::__cxx11::
      list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::operator=(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      local_3c0 = std::__cxx11::
                  list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ::size((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)in_stack_fffffffffffffb60);
      if (0 < *(int *)(in_RDI + 0x50)) {
        poVar4 = std::operator<<((ostream *)&std::cout,"found ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3c0);
        poVar4 = std::operator<<(poVar4," configurations");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      local_3c8 = 0.0;
      if (local_3c0 == 0) {
        local_8 = 0.0;
      }
      else {
        local_3d0 = std::__cxx11::
                    list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::front((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                             *)in_stack_fffffffffffffb60);
        local_3c8 = local_3d0->first;
        local_3d8 = &local_3d0->second;
        if (1 < *(int *)(in_RDI + 0x50)) {
          poVar4 = std::operator<<((ostream *)&std::cout,"best value:");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,local_3c8);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        }
        if (2 < *(int *)(in_RDI + 0x50)) {
          poVar4 = std::operator<<((ostream *)&std::cout,"best configuration:\n");
          PrintTools::SoftPrintVector<unsigned_long>(in_stack_fffffffffffffd48);
          in_stack_fffffffffffffb60 = (MaxPlus *)std::operator<<(poVar4,local_3f8);
          std::ostream::operator<<(in_stack_fffffffffffffb60,std::endl<char,std::char_traits<char>>)
          ;
          std::__cxx11::string::~string(local_3f8);
        }
        local_8 = local_3c8;
      }
      local_3c8 = local_8;
      libDAI::MaxPlus::~MaxPlus(in_stack_fffffffffffffb60);
      libDAI::Properties::~Properties((Properties *)0x89e01d);
      return local_8;
    }
    if (3 < *(int *)(in_RDI + 0x50)) {
      pcVar6 = "New MaxPlus restart...";
      std::operator<<((ostream *)&std::cout,"New MaxPlus restart...");
      ctx = (code *)pcVar6;
    }
    libDAI::MaxPlus::init((MaxPlus *)&stack0xfffffffffffffc68,(EVP_PKEY_CTX *)ctx);
    local_3a8 = libDAI::MaxPlus::run(in_stack_000003f0);
    if (0.0 < *(double *)(in_RDI + 0x70)) {
      times(&local_50);
      local_3b0 = local_50.tms_utime - local_30.tms_utime;
      dVar7 = (double)local_3b0;
      lVar2 = sysconf(2);
      local_3b8 = dVar7 / (double)lVar2;
      if (*(double *)(in_RDI + 0x70) < local_3b8) {
        uVar3 = __cxa_allocate_exception(0x30);
        EDeadline::EDeadline
                  (in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
                   (double)in_stack_fffffffffffffb60);
        __cxa_throw(uVar3,&EDeadline::typeinfo,EDeadline::~EDeadline);
      }
    }
    if (3 < *(int *)(in_RDI + 0x50)) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Found solution with value=");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,local_3a8);
      ctx = std::endl<char,std::char_traits<char>>;
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    local_39c = local_39c + 1;
  } while( true );
}

Assistant:

double FG_SolverMaxPlus::Solve()
{
    tms ts_before, ts_after;
    times(&ts_before);

    libDAI::Properties props;
    props.Set("maxiter",_m_maxiter);
    //cout <<"FG_SolverMaxPlus::Solve() - _m_verbosity="<<_m_verbosity<<endl;
    size_t verb = (size_t) std::max( (_m_verbosity-3), 0 );
    props.Set("verbose", verb);
    props.Set("updates",_m_updateType);
    props.Set("damping",_m_damping);
    double  tol = 1e-2;
    props.Set("tol",tol);    
    libDAI::MaxPlus mp (*_m_fg, props, _m_nrSolutions);
    for(Index restI=0; restI < _m_nrRestarts; restI++)
    {
        if(_m_verbosity >= 4)
            cout << "New MaxPlus restart...";

        mp.init();
        /* GetWriteAnyTimeResults, GetResultsOFStream, GetTimingsOFStream
           are defined by BayesianGameIdenticalPayoffSolver_T< JointPolicyPureVector >
           we do not really need this (at this point at least) so let's not bother for now
           ----------
           if(GetWriteAnyTimeResults())
            mp.SetAnyTimeResults(true,
                                 GetResultsOFStream(),
                                 GetTimingsOFStream());*/
        double value = mp.run();

        if(_m_deadlineInSeconds>0)
        {
            times(&ts_after);
            clock_t utime = ts_after.tms_utime -
                ts_before.tms_utime;
            double timeSpentInS=static_cast<double>(utime) / sysconf(_SC_CLK_TCK);
            if(timeSpentInS>_m_deadlineInSeconds)
                throw(EDeadline("MaxPlus deadline exceeded"));
        }
        if(_m_verbosity >= 4)
            cout << "Found solution with value="<<value<<endl;
    }

    //save the best configurations found by max-plus...
    //const std::vector<size_t> & config = mp.GetBestConfiguration();
    //we make a copy, when mp dies, its configs go with it...
    _m_bestConfs = mp.GetBestConfigurations();



    size_t nrConfsFound = _m_bestConfs.size();
    if(_m_verbosity >= 1)
        cout << "found "<< nrConfsFound <<" configurations"<<endl;

    double value = 0.0;
    if(nrConfsFound > 0)
    {
        libDAI::MADP_util::valConf& vc = _m_bestConfs.front();
        value = vc.first;
        std::vector<size_t>& sol_vec = vc.second;
        if(_m_verbosity >= 2)
            cout << "best value:"<<value<<endl;
        if(_m_verbosity >= 3)
            cout << "best configuration:\n"<<
                PrintTools::SoftPrintVector(sol_vec)<<endl;
        return (value);
    }
    else
        return(0.0);

}